

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_interop.hpp
# Opt level: O3

core * __thiscall eos::core::to_mat(core *this,Image4u *image)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  Pixel<unsigned_char,_4> *pPVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int x;
  long lVar8;
  
  cv::Mat::Mat((Mat *)this,image->height_,image->width_,0x18);
  iVar6 = image->width_;
  if (0 < iVar6) {
    uVar5 = (ulong)(uint)image->height_;
    lVar8 = 0;
    do {
      if (0 < (int)uVar5) {
        lVar7 = 0;
        do {
          iVar6 = (int)lVar7;
          x = (int)lVar8;
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar6,x);
          uVar1 = (pPVar4->data_)._M_elems[0];
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar6,x);
          uVar2 = (pPVar4->data_)._M_elems[1];
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar6,x);
          uVar3 = (pPVar4->data_)._M_elems[2];
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar6,x);
          *(uint *)(**(long **)(this + 0x48) * lVar7 + *(long *)(this + 0x10) + lVar8 * 4) =
               CONCAT13((pPVar4->data_)._M_elems[3],CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
          lVar7 = lVar7 + 1;
          uVar5 = (ulong)image->height_;
        } while (lVar7 < (long)uVar5);
        iVar6 = image->width_;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  return this;
}

Assistant:

inline cv::Mat to_mat(const Image4u& image)
{
    cv::Mat opencv_matrix(static_cast<int>(image.height()), static_cast<int>(image.width()), CV_8UC4);
    for (int c = 0; c < image.width(); ++c)
    { // size_t
        for (int r = 0; r < image.height(); ++r)
        {
            // auto vals = image(r, c);
            opencv_matrix.at<cv::Vec4b>(r, c) =
                cv::Vec4b(image(r, c)[0], image(r, c)[1], image(r, c)[2], image(r, c)[3]);
        }
    }
    return opencv_matrix;
}